

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void ConvertRGBToUV_SSE2(__m128i *R,__m128i *G,__m128i *B,__m128i *U,__m128i *V)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m128i alVar16;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  alVar16 = *R;
  alVar1 = *G;
  auVar9._0_12_ = alVar16._0_12_;
  auVar9._12_2_ = alVar16[0]._6_2_;
  auVar9._14_2_ = alVar1[0]._6_2_;
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._0_10_ = alVar16._0_10_;
  auVar8._10_2_ = alVar1[0]._4_2_;
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._0_8_ = alVar16[0];
  auVar7._8_2_ = alVar16[0]._4_2_;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = alVar1[0]._2_2_;
  auVar6._4_2_ = alVar16[0]._2_2_;
  auVar6._0_2_ = (undefined2)alVar16[0];
  auVar6._2_2_ = (short)alVar1[0];
  auVar5._2_2_ = (short)alVar1[1];
  auVar5._0_2_ = (short)alVar16[1];
  auVar5._4_2_ = alVar16[1]._2_2_;
  auVar5._6_2_ = alVar1[1]._2_2_;
  auVar5._8_2_ = alVar16[1]._4_2_;
  auVar5._10_2_ = alVar1[1]._4_2_;
  auVar5._12_2_ = alVar16[1]._6_2_;
  auVar5._14_2_ = alVar1[1]._6_2_;
  auVar14._0_12_ = alVar1._0_12_;
  auVar14._12_2_ = alVar1[0]._6_2_;
  auVar14._14_2_ = *(undefined2 *)((long)*B + 6);
  auVar12._12_4_ = auVar14._12_4_;
  auVar12._0_10_ = alVar1._0_10_;
  auVar12._10_2_ = *(undefined2 *)((long)*B + 4);
  auVar11._10_6_ = auVar12._10_6_;
  auVar11._0_8_ = alVar1[0];
  auVar11._8_2_ = alVar1[0]._4_2_;
  auVar3._8_8_ = auVar11._8_8_;
  auVar3._6_2_ = *(undefined2 *)((long)*B + 2);
  auVar3._4_2_ = alVar1[0]._2_2_;
  auVar3._2_2_ = (short)(*B)[0];
  auVar3._0_2_ = (short)alVar1[0];
  auVar2._2_2_ = (short)(*B)[1];
  auVar2._0_2_ = (short)alVar1[1];
  auVar2._4_2_ = alVar1[1]._2_2_;
  auVar2._6_2_ = *(undefined2 *)((long)*B + 10);
  auVar2._8_2_ = alVar1[1]._4_2_;
  auVar2._10_2_ = *(undefined2 *)((long)*B + 0xc);
  auVar2._12_2_ = alVar1[1]._6_2_;
  auVar2._14_2_ = *(undefined2 *)((long)*B + 0xe);
  auVar11 = pmaddwd(auVar6,_DAT_0011e6d0);
  auVar10 = pmaddwd(_DAT_0011e6d0,auVar5);
  auVar14 = pmaddwd(auVar3,_DAT_0011e6e0);
  auVar12 = pmaddwd(_DAT_0011e6e0,auVar2);
  auVar15._0_4_ = auVar14._0_4_ + auVar11._0_4_ + 0x2020000 >> 0x12;
  auVar15._4_4_ = auVar14._4_4_ + auVar11._4_4_ + 0x2020000 >> 0x12;
  auVar15._8_4_ = auVar14._8_4_ + auVar11._8_4_ + 0x2020000 >> 0x12;
  auVar15._12_4_ = auVar14._12_4_ + auVar11._12_4_ + 0x2020000 >> 0x12;
  auVar13._0_4_ = auVar12._0_4_ + auVar10._0_4_ + 0x2020000 >> 0x12;
  auVar13._4_4_ = auVar12._4_4_ + auVar10._4_4_ + 0x2020000 >> 0x12;
  auVar13._8_4_ = auVar12._8_4_ + auVar10._8_4_ + 0x2020000 >> 0x12;
  auVar13._12_4_ = auVar12._12_4_ + auVar10._12_4_ + 0x2020000 >> 0x12;
  alVar16 = (__m128i)packssdw(auVar15,auVar13);
  *U = alVar16;
  auVar12 = pmaddwd(auVar6,_DAT_0011e700);
  auVar11 = pmaddwd(auVar5,_DAT_0011e700);
  auVar10 = pmaddwd(auVar3,_DAT_0011e710);
  auVar2 = pmaddwd(auVar2,_DAT_0011e710);
  auVar4._0_4_ = auVar10._0_4_ + auVar12._0_4_ + 0x2020000 >> 0x12;
  auVar4._4_4_ = auVar10._4_4_ + auVar12._4_4_ + 0x2020000 >> 0x12;
  auVar4._8_4_ = auVar10._8_4_ + auVar12._8_4_ + 0x2020000 >> 0x12;
  auVar4._12_4_ = auVar10._12_4_ + auVar12._12_4_ + 0x2020000 >> 0x12;
  auVar10._0_4_ = auVar2._0_4_ + auVar11._0_4_ + 0x2020000 >> 0x12;
  auVar10._4_4_ = auVar2._4_4_ + auVar11._4_4_ + 0x2020000 >> 0x12;
  auVar10._8_4_ = auVar2._8_4_ + auVar11._8_4_ + 0x2020000 >> 0x12;
  auVar10._12_4_ = auVar2._12_4_ + auVar11._12_4_ + 0x2020000 >> 0x12;
  alVar16 = (__m128i)packssdw(auVar4,auVar10);
  *V = alVar16;
  return;
}

Assistant:

static WEBP_INLINE void ConvertRGBToUV_SSE2(const __m128i* const R,
                                            const __m128i* const G,
                                            const __m128i* const B,
                                            __m128i* const U,
                                            __m128i* const V) {
  const __m128i kRG_u = MK_CST_16(-9719, -19081);
  const __m128i kGB_u = MK_CST_16(0, 28800);
  const __m128i kRG_v = MK_CST_16(28800, 0);
  const __m128i kGB_v = MK_CST_16(-24116, -4684);
  const __m128i kHALF_UV = _mm_set1_epi32(((128 << YUV_FIX) + YUV_HALF) << 2);

  const __m128i RG_lo = _mm_unpacklo_epi16(*R, *G);
  const __m128i RG_hi = _mm_unpackhi_epi16(*R, *G);
  const __m128i GB_lo = _mm_unpacklo_epi16(*G, *B);
  const __m128i GB_hi = _mm_unpackhi_epi16(*G, *B);
  TRANSFORM(RG_lo, RG_hi, GB_lo, GB_hi, kRG_u, kGB_u,
            kHALF_UV, YUV_FIX + 2, *U);
  TRANSFORM(RG_lo, RG_hi, GB_lo, GB_hi, kRG_v, kGB_v,
            kHALF_UV, YUV_FIX + 2, *V);
}